

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_utility.cc
# Opt level: O1

string * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::AppendPathSegmentToPrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,StringPiece prefix,
          StringPiece segment)

{
  char *pcVar1;
  AlphaNum local_a0;
  _anonymous_namespace_ *local_70;
  char *local_68;
  AlphaNum local_40;
  
  local_a0.piece_size_ = (size_t)segment.ptr_;
  local_a0.piece_data_ = (char *)prefix.length_;
  local_68 = prefix.ptr_;
  if (local_68 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((AlphaNum *)local_a0.piece_data_ == (AlphaNum *)0x0) goto LAB_00317ad3;
    local_68 = ((AlphaNum *)local_a0.piece_data_)->digits +
               (long)(((AlphaNum *)local_a0.piece_size_)->digits + -0x20);
    this = (_anonymous_namespace_ *)local_a0.piece_data_;
    pcVar1 = local_68;
  }
  else {
    if ((AlphaNum *)local_a0.piece_size_ != (AlphaNum *)0x0) {
      local_70 = this;
      if ((1 < (long)local_a0.piece_size_) &&
         (*(short *)&((AlphaNum *)local_a0.piece_data_)->piece_data_ == 0x225b)) {
        local_40.piece_data_ = local_a0.piece_data_;
        local_40.piece_size_ = local_a0.piece_size_;
        StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_70,&local_40,
                          (AlphaNum *)local_a0.piece_data_);
        return __return_storage_ptr__;
      }
      local_40.piece_data_ = ".";
      local_40.piece_size_ = 1;
      StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_70,&local_40,&local_a0,
                        (AlphaNum *)local_a0.piece_size_);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (this == (_anonymous_namespace_ *)0x0) {
LAB_00317ad3:
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    local_68 = local_68 + (long)this;
    pcVar1 = (char *)0x0;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this,local_68,local_a0.piece_data_,pcVar1,
             segment.length_);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendPathSegmentToPrefix(StringPiece prefix,
                                      StringPiece segment) {
  if (prefix.empty()) {
    return std::string(segment);
  }
  if (segment.empty()) {
    return std::string(prefix);
  }
  // If the segment is a map key, appends it to the prefix without the ".".
  if (HasPrefixString(segment, "[\"")) {
    return StrCat(prefix, segment);
  }
  return StrCat(prefix, ".", segment);
}